

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMaybe.hpp
# Opt level: O2

Maybe<eglu::Error> * __thiscall
tcu::Maybe<eglu::Error>::operator=(Maybe<eglu::Error> *this,Error *val)

{
  if (this->m_ptr != (Error *)0x0) {
    (*(code *)**(undefined8 **)this->m_ptr)();
  }
  eglu::Error::Error((Error *)&this->field_1,val);
  this->m_ptr = (Error *)&this->field_1;
  return this;
}

Assistant:

Maybe<T>& Maybe<T>::operator= (const T& val)
{
	if (m_ptr)
		m_ptr->~T();

	m_ptr = new(m_data)T(val);

	return *this;
}